

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_fspic.cpp
# Opt level: O3

int HU_FSDisplay(uint handle,bool newval)

{
  int iVar1;
  TArray<FHudPic,_FHudPic> *pTVar2;
  
  pTVar2 = GetPicList();
  iVar1 = -1;
  if (handle < pTVar2->Count) {
    if (0 < pTVar2->Array[handle].texturenum.texnum) {
      pTVar2->Array[handle].draw = newval;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int HU_FSDisplay(unsigned handle, bool newval)
{
	TArray<FHudPic> &piclist=GetPicList();
	
	if(handle >= piclist.Size()) return -1;
	if(!piclist[handle].texturenum.isValid()) return -1;

	piclist[handle].draw = newval;
	return 0;
}